

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateFieldValueExpression
          (Generator *this,Printer *printer,char *obj_reference,FieldDescriptor *field,
          bool use_default)

{
  char *pcVar1;
  bool bVar2;
  CppType CVar3;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *pFVar4;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  char *local_1e8;
  bool local_1a2;
  allocator local_1a1;
  string local_1a0;
  string local_180;
  allocator local_159;
  string local_158;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  allocator local_51;
  string local_50;
  bool local_2a;
  byte local_29;
  bool is_float_or_double;
  FieldDescriptor *pFStack_28;
  bool use_default_local;
  FieldDescriptor *field_local;
  char *obj_reference_local;
  Printer *printer_local;
  Generator *this_local;
  
  local_29 = use_default;
  pFStack_28 = field;
  field_local = (FieldDescriptor *)obj_reference;
  obj_reference_local = &printer->variable_delimiter_;
  printer_local = (Printer *)this;
  CVar3 = FieldDescriptor::cpp_type(field);
  local_1a2 = true;
  pFVar4 = extraout_RDX;
  if (CVar3 != CPPTYPE_FLOAT) {
    CVar3 = FieldDescriptor::cpp_type(pFStack_28);
    local_1a2 = CVar3 == CPPTYPE_DOUBLE;
    pFVar4 = extraout_RDX_00;
  }
  pcVar1 = obj_reference_local;
  local_2a = local_1a2;
  if ((local_29 & 1) == 0) {
    if (local_1a2 == false) {
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                (&local_180,(_anonymous_namespace_ *)pFStack_28,pFVar4);
      pFVar4 = field_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1a0,(char *)pFVar4,&local_1a1);
      io::Printer::Print((Printer *)pcVar1,"jspb.Message.getField($obj$, $index$)","index",
                         &local_180,"obj",&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      std::__cxx11::string::~string((string *)&local_180);
    }
    else {
      bVar2 = FieldDescriptor::is_required(pFStack_28);
      pcVar1 = obj_reference_local;
      if (bVar2) {
        (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                  (&local_c8,(_anonymous_namespace_ *)pFStack_28,field_02);
        pFVar4 = field_local;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e8,(char *)pFVar4,&local_e9);
        io::Printer::Print((Printer *)pcVar1,"+jspb.Message.getField($obj$, $index$)","index",
                           &local_c8,"obj",&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      else {
        bVar2 = FieldDescriptor::is_repeated(pFStack_28);
        if (bVar2) {
          local_1e8 = "GPBFieldRepeated";
        }
        else {
          local_1e8 = "GPBFieldOptional";
        }
        local_1e8 = local_1e8 + 8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_110,local_1e8,&local_111);
        (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                  (&local_138,(_anonymous_namespace_ *)pFStack_28,field_03);
        pFVar4 = field_local;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_158,(char *)pFVar4,&local_159);
        io::Printer::Print((Printer *)pcVar1,
                           "jspb.Message.get$cardinality$FloatingPointField($obj$, $index$)",
                           "cardinality",&local_110,"index",&local_138,"obj",&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator((allocator<char> *)&local_111);
      }
    }
  }
  else {
    if (local_1a2 != false) {
      io::Printer::Print((Printer *)obj_reference_local,"+");
    }
    pcVar1 = obj_reference_local;
    pFVar4 = field_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,(char *)pFVar4,&local_51);
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              (&local_88,(_anonymous_namespace_ *)pFStack_28,field_00);
    (anonymous_namespace)::JSFieldDefault_abi_cxx11_
              (&local_a8,(_anonymous_namespace_ *)pFStack_28,field_01);
    io::Printer::Print((Printer *)pcVar1,
                       "jspb.Message.getFieldWithDefault($obj$, $index$, $default$)","obj",&local_50
                       ,"index",&local_88,"default",&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return;
}

Assistant:

void Generator::GenerateFieldValueExpression(io::Printer* printer,
                                             const char *obj_reference,
                                             const FieldDescriptor* field,
                                             bool use_default) const {
  bool is_float_or_double =
      field->cpp_type() == FieldDescriptor::CPPTYPE_FLOAT ||
      field->cpp_type() == FieldDescriptor::CPPTYPE_DOUBLE;
  if (use_default) {
    if (is_float_or_double) {
      // Coerce "Nan" and "Infinity" to actual float values.
      //
      // This will change null to 0, but that doesn't matter since we're getting
      // with a default.
      printer->Print("+");
    }

    printer->Print(
        "jspb.Message.getFieldWithDefault($obj$, $index$, $default$)",
        "obj", obj_reference,
        "index", JSFieldIndex(field),
        "default", JSFieldDefault(field));
  } else {
    if (is_float_or_double) {
      if (field->is_required()) {
        // Use "+" to convert all fields to numeric (including null).
        printer->Print(
            "+jspb.Message.getField($obj$, $index$)",
            "index", JSFieldIndex(field),
            "obj", obj_reference);
      } else {
        // Converts "NaN" and "Infinity" while preserving null.
        printer->Print(
            "jspb.Message.get$cardinality$FloatingPointField($obj$, $index$)",
            "cardinality", field->is_repeated() ? "Repeated" : "Optional",
            "index", JSFieldIndex(field),
            "obj", obj_reference);
      }
    } else {
      printer->Print("jspb.Message.getField($obj$, $index$)",
                     "index", JSFieldIndex(field),
                     "obj", obj_reference);
    }
  }
}